

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O0

void __thiscall
TeamCityTestOutput::printCurrentTestStarted(TeamCityTestOutput *this,UtestShell *test)

{
  uint uVar1;
  char *pcVar2;
  undefined1 local_48 [32];
  UtestShell *local_18;
  UtestShell *test_local;
  TeamCityTestOutput *this_local;
  
  local_18 = test;
  test_local = (UtestShell *)this;
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])
            (this,"##teamcity[testStarted name=\'");
  UtestShell::getName((UtestShell *)&stack0xffffffffffffffd8);
  pcVar2 = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffd8);
  printEscaped(this,pcVar2);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd8);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\']\n");
  uVar1 = (*local_18->_vptr_UtestShell[6])();
  if ((uVar1 & 1) == 0) {
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])
              (this,"##teamcity[testIgnored name=\'");
    UtestShell::getName((UtestShell *)local_48);
    pcVar2 = SimpleString::asCharString((SimpleString *)local_48);
    printEscaped(this,pcVar2);
    SimpleString::~SimpleString((SimpleString *)local_48);
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\']\n");
  }
  this->currtest_ = local_18;
  return;
}

Assistant:

void TeamCityTestOutput::printCurrentTestStarted(const UtestShell& test)
{
    print("##teamcity[testStarted name='");
    printEscaped(test.getName().asCharString());
    print("']\n");
    if (!test.willRun()) {
        print("##teamcity[testIgnored name='");
        printEscaped(test.getName().asCharString());
        print("']\n");
    }
    currtest_ = &test;
}